

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_reset_matchState
                 (ZSTD_matchState_t *ms,ZSTD_cwksp *ws,ZSTD_compressionParameters *cParams,
                 ZSTD_useRowMatchFinderMode_e useRowMatchFinder,ZSTD_compResetPolicy_e crp,
                 ZSTD_indexResetPolicy_e forceResetIndex,ZSTD_resetTarget_e forWho)

{
  uint uVar1;
  ZSTD_cwksp_alloc_phase_e ZVar2;
  ZSTD_strategy ZVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  size_t __n;
  U32 *pUVar9;
  ZSTD_optimal_t *pZVar10;
  byte bVar11;
  int iVar12;
  U32 UVar13;
  ZSTD_optimal_t *pZVar14;
  ulong uVar15;
  ZSTD_match_t *pZVar16;
  ZSTD_optimal_t *pZVar17;
  ZSTD_optimal_t *pZVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  
  if (((forWho == ZSTD_resetTarget_CDict) && (ms->dedicatedDictSearch != 0)) ||
     ((cParams->strategy != ZSTD_fast &&
      (useRowMatchFinder != ZSTD_urm_enableRowMatchFinder || 2 < cParams->strategy - ZSTD_greedy))))
  {
    lVar19 = 4L << ((byte)cParams->chainLog & 0x3f);
  }
  else {
    lVar19 = 0;
  }
  uVar1 = cParams->hashLog;
  uVar8 = 0;
  if ((forWho == ZSTD_resetTarget_CCtx) && (uVar8 = 0, cParams->minMatch == 3)) {
    uVar8 = 0x11;
    if (cParams->windowLog < 0x11) {
      uVar8 = cParams->windowLog;
    }
  }
  lVar20 = 4L << ((byte)uVar8 & 0x3f);
  if (forceResetIndex == ZSTDirp_reset) {
    *(undefined8 *)&(ms->window).nbOverflowCorrections = 0;
    iVar21 = 0x6e77f9;
    (ms->window).base = "";
    (ms->window).dictBase = "";
    iVar12 = 0x6e77fa;
    (ms->window).nextSrc = (BYTE *)"PK\x06\x06";
    pZVar14 = (ZSTD_optimal_t *)ws->objectEnd;
    ws->tableValidEnd = pZVar14;
  }
  else {
    iVar12 = (int)(ms->window).nextSrc;
    iVar21 = (int)(ms->window).base;
    pZVar14 = (ZSTD_optimal_t *)ws->objectEnd;
  }
  ms->hashLog3 = uVar8;
  UVar13 = iVar12 - iVar21;
  (ms->window).lowLimit = UVar13;
  (ms->window).dictLimit = UVar13;
  ms->nextToUpdate = UVar13;
  ms->loadedDictEnd = 0;
  (ms->opt).litLengthSum = 0;
  bVar11 = (byte)uVar1;
  ms->dictMatchState = (ZSTD_matchState_t *)0x0;
  ws->tableEnd = pZVar14;
  ZVar2 = ws->phase;
  if (ZVar2 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = pZVar14;
    }
    pZVar17 = (ZSTD_optimal_t *)ws->allocStart;
    pZVar18 = (ZSTD_optimal_t *)
              ((long)pZVar17->rep + (((ulong)(uint)-(int)pZVar17 | 0xffffffffffffffc0) - 0x10));
    if (pZVar18 < pZVar14) {
      ws->allocFailed = '\x01';
    }
    else {
      if (pZVar18 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar18;
      }
      ws->allocStart = pZVar18;
      pZVar10 = (ZSTD_optimal_t *)((long)pZVar14->rep + ((ulong)(-(int)pZVar14 & 0x3f) - 0x10));
      pZVar17 = pZVar18;
      if (pZVar10 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar10;
        ws->tableEnd = pZVar10;
        ws->tableValidEnd = pZVar10;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        pZVar14 = pZVar10;
        goto LAB_005cb2ea;
      }
    }
    ms->hashTable = (U32 *)0x0;
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar18 = (ZSTD_optimal_t *)
              ((long)pZVar17->rep + (((ulong)(uint)-(int)pZVar17 | 0xffffffffffffffc0) - 0x10));
    if (pZVar18 < pZVar14) {
      ws->allocFailed = '\x01';
      pZVar18 = pZVar17;
    }
    else {
      if (pZVar18 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar18;
      }
      ws->allocStart = pZVar18;
      pZVar17 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar17 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar17;
        ws->tableEnd = pZVar17;
        ws->tableValidEnd = pZVar17;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_005cb305;
      }
    }
    ms->chainTable = (U32 *)0x0;
    if (uVar8 == 0) {
      lVar20 = 0;
    }
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar18 = (ZSTD_optimal_t *)
              ((long)pZVar18->rep + (((ulong)(uint)-(int)pZVar18 | 0xffffffffffffffc0) - 0x10));
    if (pZVar18 < pZVar14) {
      ws->allocFailed = '\x01';
    }
    else {
      if (pZVar18 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar18;
      }
      ws->allocStart = pZVar18;
      pZVar17 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar17 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar17;
        ws->tableEnd = pZVar17;
        ws->tableValidEnd = pZVar17;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        pZVar14 = pZVar17;
        goto LAB_005cb329;
      }
    }
LAB_005cb41f:
    pZVar17 = pZVar14;
    pZVar14 = (ZSTD_optimal_t *)0x0;
  }
  else {
    pZVar18 = (ZSTD_optimal_t *)ws->allocStart;
LAB_005cb2ea:
    pZVar17 = (ZSTD_optimal_t *)((long)pZVar14->rep + (4L << (bVar11 & 0x3f)) + -0x10);
    if (pZVar18 < pZVar17) {
      ws->allocFailed = '\x01';
      pZVar10 = (ZSTD_optimal_t *)0x0;
      pZVar17 = pZVar14;
    }
    else {
      ws->tableEnd = pZVar17;
      pZVar10 = pZVar14;
    }
    ms->hashTable = (U32 *)pZVar10;
LAB_005cb305:
    pZVar14 = (ZSTD_optimal_t *)((long)pZVar17->rep + lVar19 + -0x10);
    if (pZVar18 < pZVar14) {
      ws->allocFailed = '\x01';
      pZVar14 = pZVar17;
      pZVar17 = (ZSTD_optimal_t *)0x0;
    }
    else {
      ws->tableEnd = pZVar14;
    }
    ms->chainTable = (U32 *)pZVar17;
    if (uVar8 == 0) {
      lVar20 = 0;
    }
LAB_005cb329:
    pZVar17 = (ZSTD_optimal_t *)((long)pZVar14->rep + lVar20 + -0x10);
    if (pZVar18 < pZVar17) {
      ws->allocFailed = '\x01';
      goto LAB_005cb41f;
    }
    ws->tableEnd = pZVar17;
  }
  ms->hashTable3 = (U32 *)pZVar14;
  if (ws->allocFailed != '\0') {
    return 0xffffffffffffffc0;
  }
  if (crp != ZSTDcrp_leaveDirty) {
    pZVar14 = (ZSTD_optimal_t *)ws->tableValidEnd;
    if (pZVar14 < pZVar17) {
      memset(pZVar14,0,(long)pZVar17 - (long)pZVar14);
      pZVar17 = (ZSTD_optimal_t *)ws->tableEnd;
      pZVar14 = (ZSTD_optimal_t *)ws->tableValidEnd;
    }
    if (pZVar14 < pZVar17) {
      ws->tableValidEnd = pZVar17;
    }
  }
  if (cParams->strategy < ZSTD_btopt || forWho != ZSTD_resetTarget_CCtx) {
    if (useRowMatchFinder != ZSTD_urm_enableRowMatchFinder ||
        cParams->strategy - ZSTD_btlazy2 < 0xfffffffd) goto LAB_005cb6cd;
    __n = 2L << (bVar11 & 0x3f);
    if (ws->phase < ZSTD_cwksp_alloc_aligned) {
      if (ws->phase == ZSTD_cwksp_alloc_objects) {
        ws->tableValidEnd = ws->objectEnd;
      }
      pZVar14 = (ZSTD_optimal_t *)
                (((ulong)(uint)-(int)ws->allocStart | 0xffffffffffffffc0) + (long)ws->allocStart);
      if (pZVar14 < pZVar17) {
LAB_005cb54d:
        ws->allocFailed = '\x01';
      }
      else {
        if (pZVar14 < (ZSTD_optimal_t *)ws->tableValidEnd) {
          ws->tableValidEnd = pZVar14;
        }
        ws->allocStart = pZVar14;
        pZVar17 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
        if (pZVar17 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
          ws->objectEnd = pZVar17;
          ws->tableEnd = pZVar17;
          ws->tableValidEnd = pZVar17;
          ws->phase = ZSTD_cwksp_alloc_aligned;
          goto LAB_005cb533;
        }
      }
LAB_005cb551:
      ms->tagTable = (U16 *)0x0;
    }
    else {
LAB_005cb533:
      uVar15 = __n + 0x3f & 0xffffffffffffffc0;
      if (uVar15 == 0) goto LAB_005cb551;
      pZVar14 = (ZSTD_optimal_t *)((long)ws->allocStart - uVar15);
      if (pZVar14 < pZVar17) goto LAB_005cb54d;
      if (pZVar14 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar14;
      }
      ws->allocStart = pZVar14;
      ms->tagTable = (U16 *)pZVar14;
      memset(pZVar14,0,__n);
    }
    ms->rowHashLog = (cParams->hashLog - 5) + (uint)(cParams->searchLog < 5);
    goto LAB_005cb6cd;
  }
  ZVar2 = ws->phase;
  if (ZVar2 < ZSTD_cwksp_alloc_aligned) {
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar18 = (ZSTD_optimal_t *)ws->allocStart;
    pZVar14 = (ZSTD_optimal_t *)
              ((long)pZVar18->rep + (((ulong)(uint)-(int)pZVar18 | 0xffffffffffffffc0) - 0x10));
    if (pZVar14 < pZVar17) {
      ws->allocFailed = '\x01';
      pZVar14 = pZVar18;
    }
    else {
      if (pZVar14 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar14;
      }
      ws->allocStart = pZVar14;
      pZVar18 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar18 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar18;
        ws->tableEnd = pZVar18;
        ws->tableValidEnd = pZVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_005cb5a5;
      }
    }
    (ms->opt).litFreq = (uint *)0x0;
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar10 = (ZSTD_optimal_t *)
              ((long)pZVar14->rep + (((ulong)(uint)-(int)pZVar14 | 0xffffffffffffffc0) - 0x10));
    if (pZVar10 < pZVar17) {
      ws->allocFailed = '\x01';
      pZVar10 = pZVar14;
    }
    else {
      if (pZVar10 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar10;
      }
      ws->allocStart = pZVar10;
      pZVar18 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar18 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar18;
        ws->tableEnd = pZVar18;
        ws->tableValidEnd = pZVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_005cb5ec;
      }
    }
    (ms->opt).litLengthFreq = (uint *)0x0;
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar14 = (ZSTD_optimal_t *)
              ((long)pZVar10->rep + (((ulong)(uint)-(int)pZVar10 | 0xffffffffffffffc0) - 0x10));
    if (pZVar14 < pZVar17) {
      ws->allocFailed = '\x01';
      pZVar14 = pZVar10;
    }
    else {
      if (pZVar14 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar14;
      }
      ws->allocStart = pZVar14;
      pZVar18 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar18 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar18;
        ws->tableEnd = pZVar18;
        ws->tableValidEnd = pZVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_005cb61b;
      }
    }
    (ms->opt).matchLengthFreq = (uint *)0x0;
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar10 = (ZSTD_optimal_t *)
              ((long)pZVar14->rep + (((ulong)(uint)-(int)pZVar14 | 0xffffffffffffffc0) - 0x10));
    if (pZVar10 < pZVar17) {
      ws->allocFailed = '\x01';
      pZVar10 = pZVar14;
    }
    else {
      if (pZVar10 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar10;
      }
      ws->allocStart = pZVar10;
      pZVar18 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar18 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar18;
        ws->tableEnd = pZVar18;
        ws->tableValidEnd = pZVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_005cb64a;
      }
    }
    (ms->opt).offCodeFreq = (uint *)0x0;
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar14 = (ZSTD_optimal_t *)
              ((long)pZVar10->rep + (((ulong)(uint)-(int)pZVar10 | 0xffffffffffffffc0) - 0x10));
    if (pZVar14 < pZVar17) {
      ws->allocFailed = '\x01';
      pZVar14 = pZVar10;
    }
    else {
      if (pZVar14 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar14;
      }
      ws->allocStart = pZVar14;
      pZVar18 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
      if (pZVar18 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
        ws->objectEnd = pZVar18;
        ws->tableEnd = pZVar18;
        ws->tableValidEnd = pZVar18;
        ws->phase = ZSTD_cwksp_alloc_aligned;
        goto LAB_005cb676;
      }
    }
    (ms->opt).matchTable = (ZSTD_match_t *)0x0;
    if (ZVar2 == ZSTD_cwksp_alloc_objects) {
      ws->tableValidEnd = ws->objectEnd;
    }
    pZVar10 = (ZSTD_optimal_t *)
              ((long)pZVar14->rep + (((ulong)(uint)-(int)pZVar14 | 0xffffffffffffffc0) - 0x10));
    if (pZVar10 < pZVar17) goto LAB_005cb6b0;
    if (pZVar10 < (ZSTD_optimal_t *)ws->tableValidEnd) {
      ws->tableValidEnd = pZVar10;
    }
    ws->allocStart = pZVar10;
    pZVar18 = (ZSTD_optimal_t *)((ulong)(-(int)ws->objectEnd & 0x3f) + (long)ws->objectEnd);
    if (pZVar18 <= (ZSTD_optimal_t *)ws->workspaceEnd) {
      ws->objectEnd = pZVar18;
      ws->tableEnd = pZVar18;
      ws->tableValidEnd = pZVar18;
      ws->phase = ZSTD_cwksp_alloc_aligned;
      goto LAB_005cb6a5;
    }
LAB_005cb6b4:
    pZVar14 = (ZSTD_optimal_t *)0x0;
  }
  else {
    pZVar14 = (ZSTD_optimal_t *)ws->allocStart;
    pZVar18 = pZVar17;
LAB_005cb5a5:
    pUVar9 = &pZVar14[-0x25].litlen;
    if (pUVar9 < pZVar18) {
      ws->allocFailed = '\x01';
      pUVar9 = (U32 *)0x0;
      pZVar10 = pZVar14;
    }
    else {
      if (pUVar9 < ws->tableValidEnd) {
        ws->tableValidEnd = pUVar9;
      }
      ws->allocStart = pUVar9;
      pZVar10 = (ZSTD_optimal_t *)pUVar9;
    }
    (ms->opt).litFreq = pUVar9;
LAB_005cb5ec:
    pUVar9 = &pZVar10[-7].off;
    if (pUVar9 < pZVar18) {
      ws->allocFailed = '\x01';
      pUVar9 = (U32 *)0x0;
      pZVar14 = pZVar10;
    }
    else {
      if (pUVar9 < ws->tableValidEnd) {
        ws->tableValidEnd = pUVar9;
      }
      ws->allocStart = pUVar9;
      pZVar14 = (ZSTD_optimal_t *)pUVar9;
    }
    (ms->opt).litLengthFreq = pUVar9;
LAB_005cb61b:
    pZVar17 = (ZSTD_optimal_t *)(pZVar14[-10].rep + 2);
    if (pZVar17 < pZVar18) {
      ws->allocFailed = '\x01';
      pZVar17 = (ZSTD_optimal_t *)0x0;
      pZVar10 = pZVar14;
    }
    else {
      if (pZVar17 < (ZSTD_optimal_t *)ws->tableValidEnd) {
        ws->tableValidEnd = pZVar17;
      }
      ws->allocStart = pZVar17;
      pZVar10 = pZVar17;
    }
    (ms->opt).matchLengthFreq = (uint *)pZVar17;
LAB_005cb64a:
    pUVar9 = &pZVar10[-5].litlen;
    if (pUVar9 < pZVar18) {
      ws->allocFailed = '\x01';
      pUVar9 = (U32 *)0x0;
      pZVar14 = pZVar10;
    }
    else {
      if (pUVar9 < ws->tableValidEnd) {
        ws->tableValidEnd = pUVar9;
      }
      ws->allocStart = pUVar9;
      pZVar14 = (ZSTD_optimal_t *)pUVar9;
    }
    (ms->opt).offCodeFreq = pUVar9;
LAB_005cb676:
    pZVar10 = (ZSTD_optimal_t *)&pZVar14[-0x495].litlen;
    if (pZVar10 < pZVar18) {
      ws->allocFailed = '\x01';
      pZVar10 = pZVar14;
      pZVar16 = (ZSTD_match_t *)0x0;
    }
    else {
      if (pZVar10 < ws->tableValidEnd) {
        ws->tableValidEnd = pZVar10;
      }
      ws->allocStart = pZVar10;
      pZVar16 = (ZSTD_match_t *)pZVar10;
    }
    (ms->opt).matchTable = pZVar16;
LAB_005cb6a5:
    pZVar14 = (ZSTD_optimal_t *)(pZVar10[-0x1003].rep + 1);
    if (pZVar14 < pZVar18) {
LAB_005cb6b0:
      ws->allocFailed = '\x01';
      goto LAB_005cb6b4;
    }
    if (pZVar14 < (ZSTD_optimal_t *)ws->tableValidEnd) {
      ws->tableValidEnd = pZVar14;
    }
    ws->allocStart = pZVar14;
  }
  (ms->opt).priceTable = pZVar14;
LAB_005cb6cd:
  uVar4 = cParams->windowLog;
  uVar5 = cParams->chainLog;
  uVar6 = cParams->hashLog;
  uVar7 = cParams->searchLog;
  uVar1 = cParams->minMatch;
  uVar8 = cParams->targetLength;
  ZVar3 = cParams->strategy;
  (ms->cParams).searchLog = cParams->searchLog;
  (ms->cParams).minMatch = uVar1;
  (ms->cParams).targetLength = uVar8;
  (ms->cParams).strategy = ZVar3;
  (ms->cParams).windowLog = uVar4;
  (ms->cParams).chainLog = uVar5;
  (ms->cParams).hashLog = uVar6;
  (ms->cParams).searchLog = uVar7;
  return (ulong)(ws->allocFailed == '\0') * 0x40 - 0x40;
}

Assistant:

static size_t
ZSTD_reset_matchState(ZSTD_matchState_t* ms,
                      ZSTD_cwksp* ws,
                const ZSTD_compressionParameters* cParams,
                const ZSTD_useRowMatchFinderMode_e useRowMatchFinder,
                const ZSTD_compResetPolicy_e crp,
                const ZSTD_indexResetPolicy_e forceResetIndex,
                const ZSTD_resetTarget_e forWho)
{
    /* disable chain table allocation for fast or row-based strategies */
    size_t const chainSize = ZSTD_allocateChainTable(cParams->strategy, useRowMatchFinder,
                                                     ms->dedicatedDictSearch && (forWho == ZSTD_resetTarget_CDict))
                                ? ((size_t)1 << cParams->chainLog)
                                : 0;
    size_t const hSize = ((size_t)1) << cParams->hashLog;
    U32    const hashLog3 = ((forWho == ZSTD_resetTarget_CCtx) && cParams->minMatch==3) ? MIN(ZSTD_HASHLOG3_MAX, cParams->windowLog) : 0;
    size_t const h3Size = hashLog3 ? ((size_t)1) << hashLog3 : 0;

    DEBUGLOG(4, "reset indices : %u", forceResetIndex == ZSTDirp_reset);
    assert(useRowMatchFinder != ZSTD_urm_auto);
    if (forceResetIndex == ZSTDirp_reset) {
        ZSTD_window_init(&ms->window);
        ZSTD_cwksp_mark_tables_dirty(ws);
    }

    ms->hashLog3 = hashLog3;

    ZSTD_invalidateMatchState(ms);

    assert(!ZSTD_cwksp_reserve_failed(ws)); /* check that allocation hasn't already failed */

    ZSTD_cwksp_clear_tables(ws);

    DEBUGLOG(5, "reserving table space");
    /* table Space */
    ms->hashTable = (U32*)ZSTD_cwksp_reserve_table(ws, hSize * sizeof(U32));
    ms->chainTable = (U32*)ZSTD_cwksp_reserve_table(ws, chainSize * sizeof(U32));
    ms->hashTable3 = (U32*)ZSTD_cwksp_reserve_table(ws, h3Size * sizeof(U32));
    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");

    DEBUGLOG(4, "reset table : %u", crp!=ZSTDcrp_leaveDirty);
    if (crp!=ZSTDcrp_leaveDirty) {
        /* reset tables only */
        ZSTD_cwksp_clean_tables(ws);
    }

    /* opt parser space */
    if ((forWho == ZSTD_resetTarget_CCtx) && (cParams->strategy >= ZSTD_btopt)) {
        DEBUGLOG(4, "reserving optimal parser space");
        ms->opt.litFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (1<<Litbits) * sizeof(unsigned));
        ms->opt.litLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxLL+1) * sizeof(unsigned));
        ms->opt.matchLengthFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxML+1) * sizeof(unsigned));
        ms->opt.offCodeFreq = (unsigned*)ZSTD_cwksp_reserve_aligned(ws, (MaxOff+1) * sizeof(unsigned));
        ms->opt.matchTable = (ZSTD_match_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_match_t));
        ms->opt.priceTable = (ZSTD_optimal_t*)ZSTD_cwksp_reserve_aligned(ws, (ZSTD_OPT_NUM+1) * sizeof(ZSTD_optimal_t));
    }

    if (ZSTD_rowMatchFinderUsed(cParams->strategy, useRowMatchFinder)) {
        {   /* Row match finder needs an additional table of hashes ("tags") */
            size_t const tagTableSize = hSize*sizeof(U16);
            ms->tagTable = (U16*)ZSTD_cwksp_reserve_aligned(ws, tagTableSize);
            if (ms->tagTable) ZSTD_memset(ms->tagTable, 0, tagTableSize);
        }
        {   /* Switch to 32-entry rows if searchLog is 5 (or more) */
            U32 const rowLog = cParams->searchLog < 5 ? 4 : 5;
            assert(cParams->hashLog > rowLog);
            ms->rowHashLog = cParams->hashLog - rowLog;
        }
    }

    ms->cParams = *cParams;

    RETURN_ERROR_IF(ZSTD_cwksp_reserve_failed(ws), memory_allocation,
                    "failed a workspace allocation in ZSTD_reset_matchState");
    return 0;
}